

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O1

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::ReplaceNonUniformAccessWithSwitchCase
          (ReplaceDescArrayAccessUsingVarIndex *this,Instruction *access_chain_final_user,
          Instruction *access_chain,uint32_t number_of_elements,
          deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *insts_to_be_cloned)

{
  bool null_const_for_phi_is_needed;
  __node_base_ptr p_Var1;
  IRContext *this_00;
  ReplaceDescArrayAccessUsingVarIndex *this_01;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t merge_id;
  BasicBlock *position;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  Instruction *pIVar6;
  __node_base_ptr p_Var7;
  uint uVar8;
  Instruction *pIVar9;
  uint32_t phi_operand;
  vector<unsigned_int,_std::allocator<unsigned_int>_> phi_operands;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> case_block;
  vector<unsigned_int,_std::allocator<unsigned_int>_> case_block_ids;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  default_block;
  uint32_t local_cc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  BasicBlock *local_90;
  Function *local_88;
  ReplaceDescArrayAccessUsingVarIndex *local_80;
  Instruction *local_78;
  deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_78 = access_chain;
  local_70 = insts_to_be_cloned;
  local_90 = IRContext::get_instr_block((this->super_Pass).context_,access_chain_final_user);
  if (local_90 != (BasicBlock *)0x0) {
    pIVar6 = (access_chain_final_user->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
             next_node_;
    pIVar9 = (Instruction *)0x0;
    if ((pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
      pIVar6 = pIVar9;
    }
    local_80 = this;
    position = SeparateInstructionsIntoNewBlock(this,local_90,pIVar6);
    local_88 = local_90->function_;
    local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (uint *)0x0;
    local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    if (number_of_elements != 0) {
      do {
        local_68._M_bucket_count = 1;
        local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_68._M_element_count = 0;
        local_68._M_rehash_policy._M_max_load_factor = 1.0;
        local_68._M_rehash_policy._M_next_resize = 0;
        local_68._M_single_bucket = (__node_base_ptr)0x0;
        pIVar6 = (position->label_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar3 = 0;
        uVar2 = 0;
        local_68._M_buckets = &local_68._M_single_bucket;
        if (pIVar6->has_result_id_ == true) {
          uVar2 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
        }
        local_b0._M_head_impl =
             CreateCaseBlock(local_80,local_78,(uint32_t)pIVar9,local_70,uVar2,
                             (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              *)&local_68);
        pIVar6 = ((local_b0._M_head_impl)->label_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        if (pIVar6->has_result_id_ == true) {
          uVar3 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
        }
        local_cc = uVar3;
        if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_a8,
                     (iterator)
                     local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_cc);
        }
        else {
          *local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = uVar3;
          local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        Function::InsertBasicBlockBefore
                  (local_88,(unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                             *)&local_b0,position);
        if (access_chain_final_user->has_result_id_ == true) {
          uVar2 = Instruction::GetSingleWordOperand
                            (access_chain_final_user,(uint)access_chain_final_user->has_type_id_);
          p_Var1 = local_68._M_buckets[(ulong)uVar2 % local_68._M_bucket_count];
          p_Var4 = (__node_base_ptr)0x0;
          if ((p_Var1 != (__node_base_ptr)0x0) &&
             (p_Var4 = p_Var1, p_Var7 = p_Var1->_M_nxt,
             *(uint32_t *)&p_Var1->_M_nxt[1]._M_nxt != uVar2)) {
            while (p_Var5 = p_Var7->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
              p_Var4 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var5[1]._M_nxt % local_68._M_bucket_count !=
                   (ulong)uVar2 % local_68._M_bucket_count) ||
                 (p_Var4 = p_Var7, p_Var7 = p_Var5, *(uint *)&p_Var5[1]._M_nxt == uVar2))
              goto LAB_001906d9;
            }
            p_Var4 = (__node_base_ptr)0x0;
          }
LAB_001906d9:
          if (p_Var4 == (__node_base_ptr)0x0) {
            p_Var5 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var5 = p_Var4->_M_nxt;
          }
          if (p_Var5 == (_Hash_node_base *)0x0) {
            __assert_fail("itr != map.end() && \"Key does not exist\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp"
                          ,0x22,
                          "uint32_t spvtools::opt::(anonymous namespace)::GetValueWithKeyExistenceCheck(uint32_t, const std::unordered_map<uint32_t, uint32_t> &)"
                         );
          }
          local_cc = *(uint32_t *)((long)&p_Var5[1]._M_nxt + 4);
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_cc);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_cc;
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        if (local_b0._M_head_impl != (BasicBlock *)0x0) {
          std::default_delete<spvtools::opt::BasicBlock>::operator()
                    ((default_delete<spvtools::opt::BasicBlock> *)&local_b0,local_b0._M_head_impl);
        }
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_68);
        uVar8 = (uint32_t)pIVar9 + 1;
        pIVar9 = (Instruction *)(ulong)uVar8;
      } while (uVar8 != number_of_elements);
    }
    null_const_for_phi_is_needed = access_chain_final_user->has_result_id_;
    pIVar6 = (position->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar3 = 0;
    uVar2 = 0;
    if (pIVar6->has_result_id_ == true) {
      uVar2 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
    }
    this_01 = local_80;
    local_68._M_buckets =
         (__buckets_ptr)CreateDefaultBlock(local_80,null_const_for_phi_is_needed,&local_c8,uVar2);
    pIVar6 = (((BasicBlock *)local_68._M_buckets)->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar6->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
    }
    Function::InsertBasicBlockBefore
              (local_88,(unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         *)&local_68,position);
    uVar2 = descsroautil::GetFirstIndexOfAccessChain(local_78);
    pIVar6 = (position->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    merge_id = 0;
    if (pIVar6->has_result_id_ == true) {
      merge_id = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
    }
    AddSwitchForAccessChain(this_01,local_90,uVar2,uVar3,merge_id,&local_a8);
    if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar2 = CreatePhiInstruction(this_01,position,&local_c8,&local_a8,uVar3);
      this_00 = (this_01->super_Pass).context_;
      uVar3 = 0;
      if (access_chain_final_user->has_result_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand
                          (access_chain_final_user,(uint)access_chain_final_user->has_type_id_);
      }
      IRContext::ReplaceAllUsesWith(this_00,uVar3,uVar2);
    }
    pIVar6 = (local_90->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar3 = 0;
    uVar2 = 0;
    if (pIVar6->has_result_id_ == true) {
      uVar2 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
    }
    pIVar6 = (position->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar6->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
    }
    ReplacePhiIncomingBlock(this_01,uVar2,uVar3);
    if ((BasicBlock *)local_68._M_buckets != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_68,
                 (BasicBlock *)local_68._M_buckets);
    }
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::ReplaceNonUniformAccessWithSwitchCase(
    Instruction* access_chain_final_user, Instruction* access_chain,
    uint32_t number_of_elements,
    const std::deque<Instruction*>& insts_to_be_cloned) const {
  auto* block = context()->get_instr_block(access_chain_final_user);
  // If the instruction does not belong to a block (i.e. in the case of
  // OpDecorate), no replacement is needed.
  if (!block) return;

  // Create merge block and add terminator
  auto* merge_block = SeparateInstructionsIntoNewBlock(
      block, access_chain_final_user->NextNode());

  auto* function = block->GetParent();

  // Add case blocks
  std::vector<uint32_t> phi_operands;
  std::vector<uint32_t> case_block_ids;
  for (uint32_t idx = 0; idx < number_of_elements; ++idx) {
    std::unordered_map<uint32_t, uint32_t> old_ids_to_new_ids_for_cloned_insts;
    std::unique_ptr<BasicBlock> case_block(CreateCaseBlock(
        access_chain, idx, insts_to_be_cloned, merge_block->id(),
        &old_ids_to_new_ids_for_cloned_insts));
    case_block_ids.push_back(case_block->id());
    function->InsertBasicBlockBefore(std::move(case_block), merge_block);

    // Keep the operand for OpPhi
    if (!access_chain_final_user->HasResultId()) continue;
    uint32_t phi_operand =
        GetValueWithKeyExistenceCheck(access_chain_final_user->result_id(),
                                      old_ids_to_new_ids_for_cloned_insts);
    phi_operands.push_back(phi_operand);
  }

  // Create default block
  std::unique_ptr<BasicBlock> default_block(
      CreateDefaultBlock(access_chain_final_user->HasResultId(), &phi_operands,
                         merge_block->id()));
  uint32_t default_block_id = default_block->id();
  function->InsertBasicBlockBefore(std::move(default_block), merge_block);

  // Create OpSwitch
  uint32_t access_chain_index_var_id =
      descsroautil::GetFirstIndexOfAccessChain(access_chain);
  AddSwitchForAccessChain(block, access_chain_index_var_id, default_block_id,
                          merge_block->id(), case_block_ids);

  // Create phi instructions
  if (!phi_operands.empty()) {
    uint32_t phi_id = CreatePhiInstruction(merge_block, phi_operands,
                                           case_block_ids, default_block_id);
    context()->ReplaceAllUsesWith(access_chain_final_user->result_id(), phi_id);
  }

  // Replace OpPhi incoming block operand that uses |block| with |merge_block|
  ReplacePhiIncomingBlock(block->id(), merge_block->id());
}